

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenmesh::optparameters::optparameters(optparameters *this)

{
  optparameters *this_local;
  
  this->max_min_volume = 0;
  this->min_max_aspectratio = 0;
  this->min_max_dihedangle = 0;
  this->imprval = 0.0;
  this->initval = 0.0;
  this->numofsearchdirs = 10;
  this->searchstep = 0.01;
  this->maxiter = -1;
  this->smthiter = 0;
  return;
}

Assistant:

optparameters() {
      max_min_volume = 0;
      min_max_aspectratio = 0;
      min_max_dihedangle = 0;

      initval = imprval = 0.0;

      numofsearchdirs = 10;
      searchstep = 0.01;
      maxiter = -1;   // Unlimited smoothing iterations.
      smthiter = 0;

    }